

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate __thiscall QDate::addYears(QDate *this,int nyears)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar4;
  int old_y;
  YearMonthDay parts;
  QDate *in_stack_ffffffffffffff90;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 *local_20;
  int local_18;
  qint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (undefined4)((ulong)in_RDI >> 0x20);
  bVar1 = isNull((QDate *)0x569aee);
  if (bVar1) {
    QDate(in_stack_ffffffffffffff90);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = -0x55555556;
    YVar4 = QGregorianCalendar::partsFromJulian
                      (CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_30 = YVar4._0_8_;
    local_18 = YVar4.day;
    local_20 = (undefined1 *)local_30;
    bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_20);
    if (bVar1) {
      iVar2 = in_ESI + (int)local_20;
      if ((0 < (int)local_20 != 0 < iVar2) || (iVar2 == 0)) {
        iVar3 = -1;
        if (0 < in_ESI) {
          iVar3 = 1;
        }
        iVar2 = iVar3 + iVar2;
      }
      local_20 = (undefined1 *)CONCAT44(local_20._4_4_,iVar2);
      YVar4.month = in_stack_ffffffffffffffb0;
      YVar4.year = uVar5;
      YVar4.day = iVar2;
      local_10 = (qint64)fixedDate(YVar4);
    }
    else {
      QDate(in_stack_ffffffffffffff90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDate)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addYears(int nyears) const
{
    if (isNull())
        return QDate();

    auto parts = QGregorianCalendar::partsFromJulian(jd);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if ((old_y > 0) != (parts.year > 0) || !parts.year)
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts);
}